

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testSerializationAPIsWork(void)

{
  uint __line;
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string buff_str;
  string packet_content_str;
  string stream_str;
  stringstream stream;
  ostream local_180 [376];
  
  std::__cxx11::string::string((string *)&packet_content_str,"example",(allocator *)&stream);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = packet::PacketT<packet::DefaultConfig>::serialize
                    ((byte_t *)packet_content_str._M_dataplus._M_p,
                     (data_len_t)packet_content_str._M_string_length,local_180);
  if (bVar1) {
    bVar1 = packet::PacketT<packet::DefaultConfig>::serialize
                      ((byte_t *)packet_content_str._M_dataplus._M_p,
                       (data_len_t)packet_content_str._M_string_length,&buffer);
    if (bVar1) {
      std::__cxx11::stringbuf::str();
      buff_str._M_dataplus._M_p = (pointer)&buff_str.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)&buff_str,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      _Var2 = std::operator==(&stream_str,&buff_str);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&buff_str);
        std::__cxx11::string::~string((string *)&stream_str);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        std::__cxx11::string::~string((string *)&packet_content_str);
        return;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"[");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"testSerializationAPIsWork");
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x4a);
      std::operator<<(poVar3,"] TEST_ASSERT failed stream_str == buff_str\n");
      __line = 0x4a;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"testSerializationAPIsWork");
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x46);
      std::operator<<(poVar3,
                      "] TEST_ASSERT failed packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), buffer)\n"
                     );
      __line = 0x46;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"testSerializationAPIsWork");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x45);
    std::operator<<(poVar3,
                    "] TEST_ASSERT failed packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), stream)\n"
                   );
    __line = 0x45;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                ,__line,"void testSerializationAPIsWork()");
}

Assistant:

void 
testSerializationAPIsWork(void)
{
  const std::string packet_content_str = "example";
  const packet::byte_t* packet_content = reinterpret_cast<const packet::byte_t*>(packet_content_str.data());
  std::stringstream stream;
  std::vector<packet::byte_t> buffer;

  // serialize both apis
  TEST_ASSERT(packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), stream));
  TEST_ASSERT(packet::DefaultPacket::serialize(packet_content, packet_content_str.size(), buffer));

  const std::string stream_str = stream.str();
  const std::string buff_str(buffer.begin(), buffer.end());
  TEST_ASSERT(stream_str == buff_str);
}